

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

void __thiscall MeshLib::Solid::destroyEdge(Solid *this,Edge *edge)

{
  int *piVar1;
  pointer pcVar2;
  Node<MeshLib::Edge> *pNVar3;
  
  if ((edge->m_halfedge[0] == (HalfEdge *)0x0) && (edge->m_halfedge[1] == (HalfEdge *)0x0)) {
    if (edge->m_trait == (Trait *)0x0) {
      pNVar3 = AVL::Node<MeshLib::Edge>::remove_node((this->m_edges).root,edge);
      (this->m_edges).root = pNVar3;
      if (pNVar3 != (Node<MeshLib::Edge> *)0x0) {
        piVar1 = &(this->m_edges).size;
        *piVar1 = *piVar1 + -1;
      }
      pcVar2 = (edge->m_string)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(edge->m_string).field_2) {
        operator_delete(pcVar2);
      }
      operator_delete(edge);
      return;
    }
    __assert_fail("edge->trait () == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                  ,0x61,"void MeshLib::Solid::destroyEdge(Edge *)");
  }
  __assert_fail("edge->halfedge (0) == NULL && edge->halfedge (1) == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                ,0x60,"void MeshLib::Solid::destroyEdge(Edge *)");
}

Assistant:

void Solid::destroyEdge (Edge * edge)
{
	assert(edge->halfedge (0) == NULL && edge->halfedge (1) == NULL);
	assert(edge->trait () == NULL);
	m_edges.remove (edge);
	delete edge;
}